

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

Image * Image::readPNG(Image *__return_storage_ptr__,path *filename)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  long lVar4;
  __jmp_buf_tag *__env;
  runtime_error *this;
  Size SVar5;
  png_structp pngPtr;
  png_uint_32 height;
  png_uint_32 width;
  int color_type;
  int bit_depth;
  long local_98;
  int local_90;
  int local_8c;
  vector<Color,_std::allocator<Color>_> *local_88;
  long local_80;
  undefined1 local_78 [4];
  undefined1 local_74 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = &__return_storage_ptr__->colorData;
  (__return_storage_ptr__->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->size).width = 0;
  (__return_storage_ptr__->size).height = 0;
  (__return_storage_ptr__->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98 = 0;
  __stream = fopen((filename->_M_pathname)._M_dataplus._M_p,"rb");
  if (((__stream == (FILE *)0x0) || (local_98 = png_create_read_struct("1.6.37",0,0), local_98 == 0)
      ) || (lVar4 = png_create_info_struct(local_98), lVar4 == 0)) {
    lVar4 = 0;
  }
  else {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_98,longjmp,200);
    iVar3 = _setjmp(__env);
    if (iVar3 == 0) {
      png_init_io(local_98,__stream);
      png_read_info(local_98,lVar4);
      png_get_IHDR(local_98,lVar4,&local_8c,&local_90,local_74,local_78,0,0,0);
      png_set_strip_16(local_98);
      png_set_expand(local_98);
      png_set_gray_to_rgb(local_98);
      png_set_add_alpha(local_98,0xff,1);
      png_read_update_info(local_98,lVar4);
      SVar5.height = local_90;
      SVar5.width = local_8c;
      __return_storage_ptr__->size = SVar5;
      std::vector<Color,_std::allocator<Color>_>::resize
                (local_88,(long)(__return_storage_ptr__->size).height * (long)local_8c);
      bVar2 = true;
      if (0 < (__return_storage_ptr__->size).height) {
        iVar3 = 0;
        local_80 = lVar4;
        do {
          png_read_row(local_98,(__return_storage_ptr__->colorData).
                                super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (long)iVar3 * (long)(__return_storage_ptr__->size).width,0);
          iVar3 = iVar3 + 1;
        } while (iVar3 < (__return_storage_ptr__->size).height);
        bVar2 = true;
        lVar4 = local_80;
      }
      goto LAB_00105aac;
    }
  }
  bVar2 = false;
LAB_00105aac:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (lVar4 != 0) {
    png_free_data(local_98,lVar4,0xffff,0xffffffff);
  }
  if (local_98 != 0) {
    png_destroy_read_struct(&local_98,0);
  }
  if (!bVar2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar1 = (filename->_M_pathname)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar1,pcVar1 + (filename->_M_pathname)._M_string_length);
    std::operator+(&local_50,"Failed to read PNG from ",&local_70);
    std::runtime_error::runtime_error(this,(string *)&local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

Image Image::readPNG(const fs::path &filename) {
	Image out;
	bool success = false;
	png_structp pngPtr = NULL;
	png_infop infoPtr = NULL;

	FILE *file = FOPEN(filename.c_str(), "rb");
	if (!file) { goto finalize; }

	pngPtr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
	if (!pngPtr) { goto finalize; }

	infoPtr = png_create_info_struct(pngPtr);
	if (!infoPtr) { goto finalize; }

	if (setjmp(png_jmpbuf(pngPtr))) { goto finalize; }

	png_init_io(pngPtr, file);
	png_read_info(pngPtr, infoPtr);

	png_uint_32 width, height;
	int bit_depth, color_type;
	png_get_IHDR(pngPtr, infoPtr, &width, &height, &bit_depth, &color_type, NULL, NULL, NULL);
	png_set_strip_16(pngPtr);
	png_set_expand(pngPtr);
	png_set_gray_to_rgb(pngPtr);
	png_set_add_alpha(pngPtr, 0xFF, PNG_FILLER_AFTER);
	png_read_update_info(pngPtr, infoPtr);

	out.fastResize({static_cast<int>(width), static_cast<int>(height)});
	for (int y = 0; y < out.size.height; y++) {
		png_read_row(pngPtr, (png_bytep)&out.pixel(0, y), NULL);
	}

	success = true;

finalize:
	if (file) { fclose(file); }
	if (infoPtr) { png_free_data(pngPtr, infoPtr, PNG_FREE_ALL, -1); }
	if (pngPtr) { png_destroy_read_struct(&pngPtr, NULL, NULL); }
	if (success) {
		return out;
	} else {
		throw std::runtime_error("Failed to read PNG from " + filename.string());
	}
}